

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

char * ON_BinaryArchive::TypecodeName(uint tcode)

{
  char *local_18;
  char *s;
  uint tcode_local;
  
  if (tcode == 0x80027fff) {
    local_18 = "TCODE_OPENNURBS_CLASS_END";
  }
  else if (tcode == 0x80400001) {
    local_18 = "TCODE_RGB";
  }
  else if (tcode == 0x80400004) {
    local_18 = "TCODE_TRANSPARENCY";
  }
  else if (tcode == 0x80400005) {
    local_18 = "TCODE_DISP_AM_RESOLUTION";
  }
  else if (tcode == 0x80400006) {
    local_18 = "TCODE_RGBDISPLAY";
  }
  else if (tcode == 0x80400012) {
    local_18 = "TCODE_LAYERVISIBLE";
  }
  else if (tcode == 0x80400013) {
    local_18 = "TCODE_LAYER_OBSELETE_1";
  }
  else if (tcode == 0x80400014) {
    local_18 = "TCODE_LAYER_OBSELETE_2";
  }
  else if (tcode == 0x80400015) {
    local_18 = "TCODE_LAYER_OBSELETE_3";
  }
  else if (tcode == 0x80400016) {
    local_18 = "TCODE_LAYERON";
  }
  else if (tcode == 0x80400017) {
    local_18 = "TCODE_LAYERTHAWED";
  }
  else if (tcode == 0x80400018) {
    local_18 = "TCODE_LAYERLOCKED";
  }
  else if (tcode == 0x80400022) {
    local_18 = "TCODE_DISP_CPLINES";
  }
  else if (tcode == 0x80400025) {
    local_18 = "TCODE_CURRENTLAYER";
  }
  else if (tcode == 0x80400030) {
    local_18 = "TCODE_LAYERPICKABLE";
  }
  else if (tcode == 0x80400031) {
    local_18 = "TCODE_LAYERSNAPABLE";
  }
  else if (tcode == 0x80400032) {
    local_18 = "TCODE_LAYERRENDERABLE";
  }
  else if (tcode == 0x80400033) {
    local_18 = "TCODE_LAYERSTATE";
  }
  else if (tcode == 0x80400034) {
    local_18 = "TCODE_LAYERINDEX";
  }
  else if (tcode == 0x80400035) {
    local_18 = "TCODE_LAYERMATERIALINDEX";
  }
  else if (tcode == 0x82000007) {
    local_18 = "TCODE_SHOWGRID";
  }
  else if (tcode == 0x82000008) {
    local_18 = "TCODE_SHOWGRIDAXES";
  }
  else if (tcode == 0x82000009) {
    local_18 = "TCODE_SHOWWORLDAXES";
  }
  else if (tcode == 0x82000011) {
    local_18 = "TCODE_MAXIMIZED_VIEWPORT";
  }
  else if (tcode == 0x82000015) {
    local_18 = "TCODE_VIEWPORT_V1_DISPLAYMODE";
  }
  else if (tcode == 0x8200006f) {
    local_18 = "TCODE_LIGHT_RECORD_END";
  }
  else if (tcode == 0x82000071) {
    local_18 = "TCODE_OBJECT_RECORD_TYPE";
  }
  else if (tcode == 0x8200007f) {
    local_18 = "TCODE_OBJECT_RECORD_END";
  }
  else if (tcode == 0x90000001) {
    local_18 = "TCODE_LAYERTABLE";
  }
  else if (tcode == 0xa0000001) {
    local_18 = "TCODE_LAYERREF";
  }
  else if (tcode == 0xa0000026) {
    local_18 = "TCODE_PROPERTIES_OPENNURBS_VERSION";
  }
  else if (tcode == 0xa0000038) {
    local_18 = "TCODE_SETTINGS_CURRENT_LAYER_INDEX";
  }
  else if (tcode == 0xa000003c) {
    local_18 = "TCODE_SETTINGS_CURRENT_WIRE_DENSITY";
  }
  else if (tcode == 0xa0000132) {
    local_18 = "TCODE_SETTINGS_CURRENT_FONT_INDEX";
  }
  else if (tcode == 0xa0000133) {
    local_18 = "TCODE_SETTINGS_CURRENT_DIMSTYLE_INDEX";
  }
  else if (tcode == 0xa000033b) {
    local_18 = "TCODE_VIEW_SHOWCONGRID";
  }
  else if (tcode == 0xa000043b) {
    local_18 = "TCODE_VIEW_SHOWCONAXES";
  }
  else if (tcode == 0xa000053b) {
    local_18 = "TCODE_VIEW_SHOWWORLDAXES";
  }
  else if (tcode == 0xa000093b) {
    local_18 = "TCODE_VIEW_V3_DISPLAYMODE";
  }
  else if (tcode == 0xc0000013) {
    local_18 = "TCODE_DICTIONARY_END";
  }
  else if (tcode == 0xffffffff) {
    local_18 = "TCODE_ENDOFTABLE";
  }
  else if (tcode == 1) {
    local_18 = "TCODE_COMMENTBLOCK";
  }
  else if (tcode == 0x100) {
    local_18 = "TCODE_STUFF";
  }
  else if (tcode == 0x7ffe) {
    local_18 = "TCODE_ENDOFFILE_GOO";
  }
  else if (tcode == 0x7fff) {
    local_18 = "TCODE_ENDOFFILE";
  }
  else if (tcode == 0x8000) {
    local_18 = "TCODE_CRC";
  }
  else if (tcode == 0x10000) {
    local_18 = "TCODE_LEGACY_GEOMETRY";
  }
  else if (tcode == 0x10001) {
    local_18 = "TCODE_LEGACY_ASM";
  }
  else if (tcode == 0x10002) {
    local_18 = "TCODE_LEGACY_PRT";
  }
  else if (tcode == 0x10003) {
    local_18 = "TCODE_LEGACY_SHL";
  }
  else if (tcode == 0x10004) {
    local_18 = "TCODE_LEGACY_FAC";
  }
  else if (tcode == 0x10005) {
    local_18 = "TCODE_LEGACY_BND";
  }
  else if (tcode == 0x10006) {
    local_18 = "TCODE_LEGACY_TRM";
  }
  else if (tcode == 0x10007) {
    local_18 = "TCODE_LEGACY_SRF";
  }
  else if (tcode == 0x10008) {
    local_18 = "TCODE_LEGACY_CRV";
  }
  else if (tcode == 0x10009) {
    local_18 = "TCODE_LEGACY_SPL";
  }
  else if (tcode == 0x1000a) {
    local_18 = "TCODE_LEGACY_PNT";
  }
  else if (tcode == 0x10101) {
    local_18 = "TCODE_LEGACY_ASMSTUFF";
  }
  else if (tcode == 0x10102) {
    local_18 = "TCODE_LEGACY_PRTSTUFF";
  }
  else if (tcode == 0x10103) {
    local_18 = "TCODE_LEGACY_SHLSTUFF";
  }
  else if (tcode == 0x10104) {
    local_18 = "TCODE_LEGACY_FACSTUFF";
  }
  else if (tcode == 0x10105) {
    local_18 = "TCODE_LEGACY_BNDSTUFF";
  }
  else if (tcode == 0x10106) {
    local_18 = "TCODE_LEGACY_TRMSTUFF";
  }
  else if (tcode == 0x10107) {
    local_18 = "TCODE_LEGACY_SRFSTUFF";
  }
  else if (tcode == 0x10108) {
    local_18 = "TCODE_LEGACY_CRVSTUFF";
  }
  else if (tcode == 0x10109) {
    local_18 = "TCODE_LEGACY_SPLSTUFF";
  }
  else if (tcode == 0x1010a) {
    local_18 = "TCODE_LEGACY_PNTSTUFF";
  }
  else if (tcode == 0x20000) {
    local_18 = "TCODE_OPENNURBS_OBJECT";
  }
  else if (tcode == 0x20008) {
    local_18 = "TCODE_RHINOIO_OBJECT_NURBS_CURVE";
  }
  else if (tcode == 0x20009) {
    local_18 = "TCODE_RHINOIO_OBJECT_NURBS_SURFACE";
  }
  else if (tcode == 0x2000b) {
    local_18 = "TCODE_RHINOIO_OBJECT_BREP";
  }
  else if (tcode == 0x27ffa) {
    local_18 = "TCODE_OPENNURBS_CLASS";
  }
  else if (tcode == 0x27ffd) {
    local_18 = "TCODE_OPENNURBS_CLASS_USERDATA";
  }
  else if (tcode == 0x28100) {
    local_18 = "TCODE_OPENNURBS_BUFFER";
  }
  else if (tcode == 0x2fff9) {
    local_18 = "TCODE_OPENNURBS_CLASS_USERDATA_HEADER";
  }
  else if (tcode == 0x2fffb) {
    local_18 = "TCODE_OPENNURBS_CLASS_UUID";
  }
  else if (tcode == 0x2fffc) {
    local_18 = "TCODE_OPENNURBS_CLASS_DATA";
  }
  else if (tcode == 0x2fffe) {
    local_18 = "TCODE_RHINOIO_OBJECT_DATA";
  }
  else if (tcode == 0x2ffff) {
    local_18 = "TCODE_RHINOIO_OBJECT_END";
  }
  else if (tcode == 0x100000) {
    local_18 = "TCODE_GEOMETRY";
  }
  else if (tcode == 0x100001) {
    local_18 = "TCODE_RH_POINT";
  }
  else if (tcode == 0x100011) {
    local_18 = "TCODE_OLD_RH_TRIMESH";
  }
  else if (tcode == 0x100012) {
    local_18 = "TCODE_OLD_MESH_VERTEX_NORMALS";
  }
  else if (tcode == 0x100013) {
    local_18 = "TCODE_OLD_MESH_UV";
  }
  else if (tcode == 0x100014) {
    local_18 = "TCODE_OLD_FULLMESH";
  }
  else if (tcode == 0x100015) {
    local_18 = "TCODE_MESH_OBJECT";
  }
  else if (tcode == 0x100017) {
    local_18 = "TCODE_COMPRESSED_MESH_GEOMETRY";
  }
  else if (tcode == 0x100018) {
    local_18 = "TCODE_ANALYSIS_MESH";
  }
  else if (tcode == 0x200000) {
    local_18 = "TCODE_ANNOTATION";
  }
  else if (tcode == 0x200001) {
    local_18 = "TCODE_ANNOTATION_SETTINGS";
  }
  else if (tcode == 0x200004) {
    local_18 = "TCODE_TEXT_BLOCK";
  }
  else if (tcode == 0x200005) {
    local_18 = "TCODE_ANNOTATION_LEADER";
  }
  else if (tcode == 0x200006) {
    local_18 = "TCODE_LINEAR_DIMENSION";
  }
  else if (tcode == 0x200007) {
    local_18 = "TCODE_ANGULAR_DIMENSION";
  }
  else if (tcode == 0x200008) {
    local_18 = "TCODE_RADIAL_DIMENSION";
  }
  else if (tcode == 0x400000) {
    local_18 = "TCODE_DISPLAY";
  }
  else if (tcode == 0x400002) {
    local_18 = "TCODE_TEXTUREMAP";
  }
  else if (tcode == 0x400003) {
    local_18 = "TCODE_BUMPMAP";
  }
  else if (tcode == 0x400007) {
    local_18 = "TCODE_RENDER_MATERIAL_ID";
  }
  else if (tcode == 0x400010) {
    local_18 = "TCODE_LAYER";
  }
  else if (tcode == 0x400011) {
    local_18 = "TCODE_LAYERNAME";
  }
  else if (tcode == 0x400020) {
    local_18 = "TCODE_RENDERMESHPARAMS";
  }
  else if (tcode == 0x400023) {
    local_18 = "TCODE_DISP_MAXLENGTH";
  }
  else if (tcode == 0x800000) {
    local_18 = "TCODE_RENDER";
  }
  else if (tcode == 0x800001) {
    local_18 = "TCODE_RH_SPOTLIGHT";
  }
  else if (tcode == 0x2000000) {
    local_18 = "TCODE_INTERFACE";
  }
  else if (tcode == 0x2000001) {
    local_18 = "TCODE_NAME";
  }
  else if (tcode == 0x2000002) {
    local_18 = "TCODE_VIEW";
  }
  else if (tcode == 0x2000003) {
    local_18 = "TCODE_CPLANE";
  }
  else if (tcode == 0x2000004) {
    local_18 = "TCODE_NAMED_CPLANE";
  }
  else if (tcode == 0x2000005) {
    local_18 = "TCODE_NAMED_VIEW";
  }
  else if (tcode == 0x2000006) {
    local_18 = "TCODE_VIEWPORT";
  }
  else if (tcode == 0x200000a) {
    local_18 = "TCODE_VIEWPORT_POSITION";
  }
  else if (tcode == 0x200000b) {
    local_18 = "TCODE_VIEWPORT_TRACEINFO";
  }
  else if (tcode == 0x200000c) {
    local_18 = "TCODE_SNAPSIZE";
  }
  else if (tcode == 0x200000d) {
    local_18 = "TCODE_NEAR_CLIP_PLANE";
  }
  else if (tcode == 0x200000e) {
    local_18 = "TCODE_HIDE_TRACE";
  }
  else if (tcode == 0x200000f) {
    local_18 = "TCODE_NOTES";
  }
  else if (tcode == 0x2000010) {
    local_18 = "TCODE_UNIT_AND_TOLERANCES";
  }
  else if (tcode == 0x2000012) {
    local_18 = "TCODE_VIEWPORT_WALLPAPER";
  }
  else if (tcode == 0x2000013) {
    local_18 = "TCODE_SUMMARY";
  }
  else if (tcode == 0x2000014) {
    local_18 = "TCODE_BITMAPPREVIEW";
  }
  else if (tcode == 0x2000073) {
    local_18 = "TCODE_OBJECT_RECORD_ATTRIBUTES_USERDATA";
  }
  else if (tcode == 0x2008061) {
    local_18 = "TCODE_LIGHT_RECORD_ATTRIBUTES";
  }
  else if (tcode == 0x2008072) {
    local_18 = "TCODE_OBJECT_RECORD_ATTRIBUTES";
  }
  else if (tcode == 0x2008074) {
    local_18 = "TCODE_OBJECT_RECORD_HISTORY";
  }
  else if (tcode == 0x2008075) {
    local_18 = "TCODE_OBJECT_RECORD_HISTORY_HEADER";
  }
  else if (tcode == 0x2008076) {
    local_18 = "TCODE_OBJECT_RECORD_HISTORY_DATA";
  }
  else if (tcode == 0x8000000) {
    local_18 = "TCODE_TOLERANCE";
  }
  else if (tcode == 0x8000001) {
    local_18 = "TCODE_LEGACY_TOL_FIT";
  }
  else if (tcode == 0x8000002) {
    local_18 = "TCODE_LEGACY_TOL_ANGLE";
  }
  else if (tcode == 0x10000000) {
    local_18 = "TCODE_TABLE";
  }
  else if (tcode == 0x10000010) {
    local_18 = "TCODE_MATERIAL_TABLE";
  }
  else if (tcode == 0x10000011) {
    local_18 = "TCODE_LAYER_TABLE";
  }
  else if (tcode == 0x10000012) {
    local_18 = "TCODE_LIGHT_TABLE";
  }
  else if (tcode == 0x10000013) {
    local_18 = "TCODE_OBJECT_TABLE";
  }
  else if (tcode == 0x10000014) {
    local_18 = "TCODE_PROPERTIES_TABLE";
  }
  else if (tcode == 0x10000015) {
    local_18 = "TCODE_SETTINGS_TABLE";
  }
  else if (tcode == 0x10000016) {
    local_18 = "TCODE_BITMAP_TABLE";
  }
  else if (tcode == 0x10000017) {
    local_18 = "TCODE_USER_TABLE";
  }
  else if (tcode == 0x10000018) {
    local_18 = "TCODE_GROUP_TABLE";
  }
  else if (tcode == 0x10000019) {
    local_18 = "TCODE_FONT_TABLE";
  }
  else if (tcode == 0x10000020) {
    local_18 = "TCODE_DIMSTYLE_TABLE";
  }
  else if (tcode == 0x10000021) {
    local_18 = "TCODE_INSTANCE_DEFINITION_TABLE";
  }
  else if (tcode == 0x10000022) {
    local_18 = "TCODE_HATCHPATTERN_TABLE";
  }
  else if (tcode == 0x10000023) {
    local_18 = "TCODE_LINETYPE_TABLE";
  }
  else if (tcode == 0x10000024) {
    local_18 = "TCODE_OBSOLETE_LAYERSET_TABLE";
  }
  else if (tcode == 0x10000025) {
    local_18 = "TCODE_TEXTURE_MAPPING_TABLE";
  }
  else if (tcode == 0x10000026) {
    local_18 = "TCODE_HISTORYRECORD_TABLE";
  }
  else if (tcode == 0x20000000) {
    local_18 = "TCODE_TABLEREC";
  }
  else if (tcode == 0x20000081) {
    local_18 = "TCODE_USER_RECORD";
  }
  else if (tcode == 0x20008021) {
    local_18 = "TCODE_PROPERTIES_REVISIONHISTORY";
  }
  else if (tcode == 0x20008022) {
    local_18 = "TCODE_PROPERTIES_NOTES";
  }
  else if (tcode == 0x20008023) {
    local_18 = "TCODE_PROPERTIES_PREVIEWIMAGE";
  }
  else if (tcode == 0x20008024) {
    local_18 = "TCODE_PROPERTIES_APPLICATION";
  }
  else if (tcode == 0x20008025) {
    local_18 = "TCODE_PROPERTIES_COMPRESSED_PREVIEWIMAGE";
  }
  else if (tcode == 0x20008031) {
    local_18 = "TCODE_SETTINGS_UNITSANDTOLS";
  }
  else if (tcode == 0x20008032) {
    local_18 = "TCODE_SETTINGS_RENDERMESH";
  }
  else if (tcode == 0x20008033) {
    local_18 = "TCODE_SETTINGS_ANALYSISMESH";
  }
  else if (tcode == 0x20008034) {
    local_18 = "TCODE_SETTINGS_ANNOTATION";
  }
  else if (tcode == 0x20008035) {
    local_18 = "TCODE_SETTINGS_NAMED_CPLANE_LIST";
  }
  else if (tcode == 0x20008036) {
    local_18 = "TCODE_SETTINGS_NAMED_VIEW_LIST";
  }
  else if (tcode == 0x20008037) {
    local_18 = "TCODE_SETTINGS_VIEW_LIST";
  }
  else if (tcode == 0x20008039) {
    local_18 = "TCODE_SETTINGS_CURRENT_MATERIAL_INDEX";
  }
  else if (tcode == 0x2000803a) {
    local_18 = "TCODE_SETTINGS_CURRENT_COLOR";
  }
  else if (tcode == 0x2000803b) {
    local_18 = "TCODE_VIEW_RECORD";
  }
  else if (tcode == 0x2000803d) {
    local_18 = "TCODE_SETTINGS_RENDER";
  }
  else if (tcode == 0x2000803e) {
    local_18 = "TCODE_SETTINGS__NEVER__USE__THIS";
  }
  else if (tcode == 0x2000803f) {
    local_18 = "TCODE_SETTINGS_GRID_DEFAULTS";
  }
  else if (tcode == 0x20008040) {
    local_18 = "TCODE_MATERIAL_RECORD";
  }
  else if (tcode == 0x20008050) {
    local_18 = "TCODE_LAYER_RECORD";
  }
  else if (tcode == 0x20008060) {
    local_18 = "TCODE_LIGHT_RECORD";
  }
  else if (tcode == 0x20008070) {
    local_18 = "TCODE_OBJECT_RECORD";
  }
  else if (tcode == 0x20008073) {
    local_18 = "TCODE_GROUP_RECORD";
  }
  else if (tcode == 0x20008074) {
    local_18 = "TCODE_FONT_RECORD";
  }
  else if (tcode == 0x20008075) {
    local_18 = "TCODE_DIMSTYLE_RECORD";
  }
  else if (tcode == 0x20008076) {
    local_18 = "TCODE_INSTANCE_DEFINITION_RECORD";
  }
  else if (tcode == 0x20008077) {
    local_18 = "TCODE_HATCHPATTERN_RECORD";
  }
  else if (tcode == 0x20008078) {
    local_18 = "TCODE_LINETYPE_RECORD";
  }
  else if (tcode == 0x20008079) {
    local_18 = "TCODE_OBSOLETE_LAYERSET_RECORD";
  }
  else if (tcode == 0x2000807a) {
    local_18 = "TCODE_TEXTURE_MAPPING_RECORD";
  }
  else if (tcode == 0x2000807b) {
    local_18 = "TCODE_HISTORYRECORD_RECORD";
  }
  else if (tcode == 0x20008080) {
    local_18 = "TCODE_USER_TABLE_UUID";
  }
  else if (tcode == 0x20008082) {
    local_18 = "TCODE_USER_TABLE_RECORD_HEADER";
  }
  else if (tcode == 0x20008090) {
    local_18 = "TCODE_BITMAP_RECORD";
  }
  else if (tcode == 0x20008131) {
    local_18 = "TCODE_SETTINGS_MODEL_URL";
  }
  else if (tcode == 0x20008134) {
    local_18 = "TCODE_SETTINGS_ATTRIBUTES";
  }
  else if (tcode == 0x20008135) {
    local_18 = "TCODE_SETTINGS_PLUGINLIST";
  }
  else if (tcode == 0x20008136) {
    local_18 = "TCODE_SETTINGS_RENDER_USERDATA";
  }
  else if (tcode == 0x2000813b) {
    local_18 = "TCODE_VIEW_CPLANE";
  }
  else if (tcode == 0x2000823b) {
    local_18 = "TCODE_VIEW_VIEWPORT";
  }
  else if (tcode == 0x2000863b) {
    local_18 = "TCODE_VIEW_TRACEIMAGE";
  }
  else if (tcode == 0x2000873b) {
    local_18 = "TCODE_VIEW_WALLPAPER";
  }
  else if (tcode == 0x2000874b) {
    local_18 = "TCODE_VIEW_WALLPAPER_V3";
  }
  else if (tcode == 0x2000883b) {
    local_18 = "TCODE_VIEW_TARGET";
  }
  else if (tcode == 0x20008a3b) {
    local_18 = "TCODE_VIEW_NAME";
  }
  else if (tcode == 0x20008b3b) {
    local_18 = "TCODE_VIEW_POSITION";
  }
  else if (tcode == 0x20008c3b) {
    local_18 = "TCODE_VIEW_ATTRIBUTES";
  }
  else if (tcode == 0x20008d3b) {
    local_18 = "TCODE_VIEW_VIEWPORT_USERDATA";
  }
  else if (tcode == 0x40000000) {
    local_18 = "TCODE_USER";
  }
  else if (tcode == 0x40000001) {
    local_18 = "TCODE_XDATA";
  }
  else if (tcode == 0x40008000) {
    local_18 = "TCODE_ANONYMOUS_CHUNK";
  }
  else if (tcode == 0x40008010) {
    local_18 = "TCODE_DICTIONARY";
  }
  else if (tcode == 0x40008011) {
    local_18 = "TCODE_DICTIONARY_ID";
  }
  else if (tcode == 0x40008012) {
    local_18 = "TCODE_DICTIONARY_ENTRY";
  }
  else {
    local_18 = (char *)0x0;
  }
  return local_18;
}

Assistant:

const char* ON_BinaryArchive::TypecodeName( unsigned int tcode )
{

  const char* s;
  switch( tcode ) 
  {
  CASEtcode2string(TCODE_FONT_TABLE);
  CASEtcode2string(TCODE_FONT_RECORD);
  CASEtcode2string(TCODE_DIMSTYLE_TABLE);
  CASEtcode2string(TCODE_DIMSTYLE_RECORD);
  CASEtcode2string(TCODE_INSTANCE_DEFINITION_RECORD);
  CASEtcode2string(TCODE_COMMENTBLOCK);
  CASEtcode2string(TCODE_ENDOFFILE);
  CASEtcode2string(TCODE_ENDOFFILE_GOO);
  CASEtcode2string(TCODE_LEGACY_GEOMETRY);
  CASEtcode2string(TCODE_OPENNURBS_OBJECT);
  CASEtcode2string(TCODE_GEOMETRY);
  CASEtcode2string(TCODE_ANNOTATION);
  CASEtcode2string(TCODE_DISPLAY);
  CASEtcode2string(TCODE_RENDER);
  CASEtcode2string(TCODE_INTERFACE);
  CASEtcode2string(TCODE_TOLERANCE);
  CASEtcode2string(TCODE_TABLE);
  CASEtcode2string(TCODE_TABLEREC);
  CASEtcode2string(TCODE_USER);
  CASEtcode2string(TCODE_SHORT);
  CASEtcode2string(TCODE_CRC);
  CASEtcode2string(TCODE_ANONYMOUS_CHUNK);
  CASEtcode2string(TCODE_MATERIAL_TABLE);
  CASEtcode2string(TCODE_LAYER_TABLE);
  CASEtcode2string(TCODE_LIGHT_TABLE);
  CASEtcode2string(TCODE_OBJECT_TABLE);
  CASEtcode2string(TCODE_PROPERTIES_TABLE);
  CASEtcode2string(TCODE_SETTINGS_TABLE);
  CASEtcode2string(TCODE_BITMAP_TABLE);
  CASEtcode2string(TCODE_USER_TABLE);
  CASEtcode2string(TCODE_INSTANCE_DEFINITION_TABLE);
  CASEtcode2string(TCODE_HATCHPATTERN_TABLE);
  CASEtcode2string(TCODE_HATCHPATTERN_RECORD);
  CASEtcode2string(TCODE_LINETYPE_TABLE);
  CASEtcode2string(TCODE_LINETYPE_RECORD);
  CASEtcode2string(TCODE_OBSOLETE_LAYERSET_TABLE);
  CASEtcode2string(TCODE_OBSOLETE_LAYERSET_RECORD);
  CASEtcode2string(TCODE_TEXTURE_MAPPING_TABLE);
  CASEtcode2string(TCODE_TEXTURE_MAPPING_RECORD);
  CASEtcode2string(TCODE_HISTORYRECORD_TABLE);  
  CASEtcode2string(TCODE_HISTORYRECORD_RECORD);
  CASEtcode2string(TCODE_ENDOFTABLE);
  CASEtcode2string(TCODE_PROPERTIES_REVISIONHISTORY);
  CASEtcode2string(TCODE_PROPERTIES_NOTES);
  CASEtcode2string(TCODE_PROPERTIES_PREVIEWIMAGE);
  CASEtcode2string(TCODE_PROPERTIES_COMPRESSED_PREVIEWIMAGE);
  CASEtcode2string(TCODE_PROPERTIES_APPLICATION);
  CASEtcode2string(TCODE_PROPERTIES_OPENNURBS_VERSION);
  CASEtcode2string(TCODE_SETTINGS_PLUGINLIST);
  CASEtcode2string(TCODE_SETTINGS_UNITSANDTOLS);
  CASEtcode2string(TCODE_SETTINGS_RENDERMESH);
  CASEtcode2string(TCODE_SETTINGS_ANALYSISMESH);
  CASEtcode2string(TCODE_SETTINGS_ANNOTATION);
  CASEtcode2string(TCODE_SETTINGS_NAMED_CPLANE_LIST);
  CASEtcode2string(TCODE_SETTINGS_NAMED_VIEW_LIST);
  CASEtcode2string(TCODE_SETTINGS_VIEW_LIST);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_LAYER_INDEX);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_MATERIAL_INDEX);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_COLOR);
  CASEtcode2string(TCODE_SETTINGS__NEVER__USE__THIS);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_WIRE_DENSITY);
  CASEtcode2string(TCODE_SETTINGS_RENDER);
  CASEtcode2string(TCODE_SETTINGS_GRID_DEFAULTS);
  CASEtcode2string(TCODE_SETTINGS_MODEL_URL);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_FONT_INDEX);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_DIMSTYLE_INDEX);
  CASEtcode2string(TCODE_SETTINGS_ATTRIBUTES);
  CASEtcode2string(TCODE_SETTINGS_RENDER_USERDATA);
  CASEtcode2string(TCODE_VIEW_RECORD);
  CASEtcode2string(TCODE_VIEW_CPLANE);
  CASEtcode2string(TCODE_VIEW_VIEWPORT);
  CASEtcode2string(TCODE_VIEW_VIEWPORT_USERDATA);
  CASEtcode2string(TCODE_VIEW_SHOWCONGRID);
  CASEtcode2string(TCODE_VIEW_SHOWCONAXES);
  CASEtcode2string(TCODE_VIEW_SHOWWORLDAXES);
  CASEtcode2string(TCODE_VIEW_TRACEIMAGE);
  CASEtcode2string(TCODE_VIEW_WALLPAPER);
  CASEtcode2string(TCODE_VIEW_WALLPAPER_V3);
  CASEtcode2string(TCODE_VIEW_TARGET);
  CASEtcode2string(TCODE_VIEW_V3_DISPLAYMODE);
  CASEtcode2string(TCODE_VIEW_NAME);
  CASEtcode2string(TCODE_VIEW_POSITION);
  CASEtcode2string(TCODE_VIEW_ATTRIBUTES);
  CASEtcode2string(TCODE_BITMAP_RECORD);
  CASEtcode2string(TCODE_MATERIAL_RECORD);
  CASEtcode2string(TCODE_LAYER_RECORD);
  CASEtcode2string(TCODE_LIGHT_RECORD);
  CASEtcode2string(TCODE_LIGHT_RECORD_ATTRIBUTES);
  CASEtcode2string(TCODE_OBJECT_RECORD_ATTRIBUTES_USERDATA);
  CASEtcode2string(TCODE_OBJECT_RECORD_HISTORY);
  CASEtcode2string(TCODE_OBJECT_RECORD_HISTORY_HEADER);
  CASEtcode2string(TCODE_OBJECT_RECORD_HISTORY_DATA);
  CASEtcode2string(TCODE_LIGHT_RECORD_END);
  CASEtcode2string(TCODE_USER_TABLE_UUID);
  CASEtcode2string(TCODE_USER_TABLE_RECORD_HEADER);
  CASEtcode2string(TCODE_USER_RECORD);
  CASEtcode2string(TCODE_GROUP_TABLE);
  CASEtcode2string(TCODE_GROUP_RECORD);
  CASEtcode2string(TCODE_OBJECT_RECORD);
  CASEtcode2string(TCODE_OBJECT_RECORD_TYPE);
  CASEtcode2string(TCODE_OBJECT_RECORD_ATTRIBUTES);
  CASEtcode2string(TCODE_OBJECT_RECORD_END);
  CASEtcode2string(TCODE_OPENNURBS_CLASS);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_UUID);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_DATA);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_USERDATA);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_USERDATA_HEADER);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_END);
  CASEtcode2string(TCODE_OPENNURBS_BUFFER);
  CASEtcode2string(TCODE_ANNOTATION_SETTINGS);
  CASEtcode2string(TCODE_TEXT_BLOCK);
  CASEtcode2string(TCODE_ANNOTATION_LEADER);
  CASEtcode2string(TCODE_LINEAR_DIMENSION);
  CASEtcode2string(TCODE_ANGULAR_DIMENSION);
  CASEtcode2string(TCODE_RADIAL_DIMENSION);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_NURBS_CURVE);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_NURBS_SURFACE);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_BREP);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_DATA);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_END);
  CASEtcode2string(TCODE_LEGACY_ASM);
  CASEtcode2string(TCODE_LEGACY_PRT);
  CASEtcode2string(TCODE_LEGACY_SHL);
  CASEtcode2string(TCODE_LEGACY_FAC);
  CASEtcode2string(TCODE_LEGACY_BND);
  CASEtcode2string(TCODE_LEGACY_TRM);
  CASEtcode2string(TCODE_LEGACY_SRF);
  CASEtcode2string(TCODE_LEGACY_CRV);
  CASEtcode2string(TCODE_LEGACY_SPL);
  CASEtcode2string(TCODE_LEGACY_PNT);
  CASEtcode2string(TCODE_STUFF);
  CASEtcode2string(TCODE_LEGACY_ASMSTUFF);
  CASEtcode2string(TCODE_LEGACY_PRTSTUFF);
  CASEtcode2string(TCODE_LEGACY_SHLSTUFF);
  CASEtcode2string(TCODE_LEGACY_FACSTUFF);
  CASEtcode2string(TCODE_LEGACY_BNDSTUFF);
  CASEtcode2string(TCODE_LEGACY_TRMSTUFF);
  CASEtcode2string(TCODE_LEGACY_SRFSTUFF);
  CASEtcode2string(TCODE_LEGACY_CRVSTUFF);
  CASEtcode2string(TCODE_LEGACY_SPLSTUFF);
  CASEtcode2string(TCODE_LEGACY_PNTSTUFF);
  CASEtcode2string(TCODE_RH_POINT);
  CASEtcode2string(TCODE_RH_SPOTLIGHT);
  CASEtcode2string(TCODE_OLD_RH_TRIMESH);
  CASEtcode2string(TCODE_OLD_MESH_VERTEX_NORMALS);
  CASEtcode2string(TCODE_OLD_MESH_UV);
  CASEtcode2string(TCODE_OLD_FULLMESH);
  CASEtcode2string(TCODE_MESH_OBJECT);
  CASEtcode2string(TCODE_COMPRESSED_MESH_GEOMETRY);
  CASEtcode2string(TCODE_ANALYSIS_MESH);
  CASEtcode2string(TCODE_NAME);
  CASEtcode2string(TCODE_VIEW);
  CASEtcode2string(TCODE_CPLANE);
  CASEtcode2string(TCODE_NAMED_CPLANE);
  CASEtcode2string(TCODE_NAMED_VIEW);
  CASEtcode2string(TCODE_VIEWPORT);
  CASEtcode2string(TCODE_SHOWGRID);
  CASEtcode2string(TCODE_SHOWGRIDAXES);
  CASEtcode2string(TCODE_SHOWWORLDAXES);
  CASEtcode2string(TCODE_VIEWPORT_POSITION);
  CASEtcode2string(TCODE_VIEWPORT_TRACEINFO);
  CASEtcode2string(TCODE_SNAPSIZE);
  CASEtcode2string(TCODE_NEAR_CLIP_PLANE);
  CASEtcode2string(TCODE_HIDE_TRACE);
  CASEtcode2string(TCODE_NOTES);
  CASEtcode2string(TCODE_UNIT_AND_TOLERANCES);
  CASEtcode2string(TCODE_MAXIMIZED_VIEWPORT);
  CASEtcode2string(TCODE_VIEWPORT_WALLPAPER);
  CASEtcode2string(TCODE_SUMMARY);
  CASEtcode2string(TCODE_BITMAPPREVIEW);
  CASEtcode2string(TCODE_VIEWPORT_V1_DISPLAYMODE);
  CASEtcode2string(TCODE_LAYERTABLE);
  CASEtcode2string(TCODE_LAYERREF);
  CASEtcode2string(TCODE_XDATA);
  CASEtcode2string(TCODE_RGB);
  CASEtcode2string(TCODE_TEXTUREMAP);
  CASEtcode2string(TCODE_BUMPMAP);
  CASEtcode2string(TCODE_TRANSPARENCY);
  CASEtcode2string(TCODE_DISP_AM_RESOLUTION);
  CASEtcode2string(TCODE_RGBDISPLAY);
  CASEtcode2string(TCODE_RENDER_MATERIAL_ID);
  CASEtcode2string(TCODE_LAYER);
  CASEtcode2string(TCODE_LAYER_OBSELETE_1);
  CASEtcode2string(TCODE_LAYER_OBSELETE_2);
  CASEtcode2string(TCODE_LAYER_OBSELETE_3);
  CASEtcode2string(TCODE_LAYERON);
  CASEtcode2string(TCODE_LAYERTHAWED);
  CASEtcode2string(TCODE_LAYERLOCKED);
  CASEtcode2string(TCODE_LAYERVISIBLE);
  CASEtcode2string(TCODE_LAYERPICKABLE);
  CASEtcode2string(TCODE_LAYERSNAPABLE);
  CASEtcode2string(TCODE_LAYERRENDERABLE);
  CASEtcode2string(TCODE_LAYERSTATE);
  CASEtcode2string(TCODE_LAYERINDEX);
  CASEtcode2string(TCODE_LAYERMATERIALINDEX);
  CASEtcode2string(TCODE_RENDERMESHPARAMS);
  CASEtcode2string(TCODE_DISP_CPLINES);
  CASEtcode2string(TCODE_DISP_MAXLENGTH);
  CASEtcode2string(TCODE_CURRENTLAYER);
  CASEtcode2string(TCODE_LAYERNAME);
  CASEtcode2string(TCODE_LEGACY_TOL_FIT);
  CASEtcode2string(TCODE_LEGACY_TOL_ANGLE);
  CASEtcode2string(TCODE_DICTIONARY);
  CASEtcode2string(TCODE_DICTIONARY_ID);
  CASEtcode2string(TCODE_DICTIONARY_ENTRY);
  CASEtcode2string(TCODE_DICTIONARY_END);
  default:
    // unknown typecode.
    s = 0; 
    break;
  }
  return s;
}